

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_compat.c
# Opt level: O3

EVaction old_EVassoc_filter_action
                   (CManager cm,EVstone stone,CMFormatList format_list,EVSimpleHandlerFunc handler,
                   EVstone out_stone,void *client_data)

{
  FMFieldList list;
  char **ppcVar1;
  int iVar2;
  EVaction EVar3;
  CMFormatList pCVar4;
  FMStructDescList incoming_format_list;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  
  uVar6 = (ulong)(uint)stone;
  if (format_list == (CMFormatList)0x0) {
    uVar7 = 0;
  }
  else {
    uVar7 = 0xffffffff;
    pCVar4 = format_list;
    do {
      uVar7 = uVar7 + 1;
      ppcVar1 = &pCVar4->format_name;
      pCVar4 = pCVar4 + 1;
    } while (*ppcVar1 != (char *)0x0);
  }
  uVar5 = (ulong)uVar7;
  incoming_format_list = (FMStructDescList)INT_CMmalloc(uVar5 * 0x20 + 0x20);
  if (uVar7 == 0) {
    uVar5 = 0;
  }
  else {
    lVar8 = 0;
    do {
      *(undefined8 *)((long)&incoming_format_list->format_name + lVar8 * 2) =
           *(undefined8 *)((long)&format_list->format_name + lVar8);
      list = *(FMFieldList *)((long)&format_list->field_list + lVar8);
      *(FMFieldList *)((long)&incoming_format_list->field_list + lVar8 * 2) = list;
      iVar2 = struct_size_field_list(list,(int)uVar6);
      *(int *)((long)&incoming_format_list->struct_size + lVar8 * 2) = iVar2;
      *(undefined8 *)((long)&incoming_format_list->opt_info + lVar8 * 2) = 0;
      lVar8 = lVar8 + 0x10;
    } while (uVar5 << 4 != lVar8);
  }
  incoming_format_list[uVar5].format_name = (char *)0x0;
  incoming_format_list[uVar5].field_list = (FMFieldList)0x0;
  EVar3 = EVassoc_filter_action(cm,stone,incoming_format_list,handler,out_stone,client_data);
  return EVar3;
}

Assistant:

extern EVaction
old_EVassoc_filter_action(CManager cm, EVstone stone, CMFormatList format_list, 
			EVSimpleHandlerFunc handler, EVstone out_stone, void* client_data)
{
    FMStructDescList structs;
    int count = 0, i;
    while (format_list && (format_list[count].format_name != NULL)) count++;
    structs = malloc(sizeof(structs[0]) * (count + 1));
    for (i = 0; i < count; i++) {
	structs[i].format_name = format_list[i].format_name;
	structs[i].field_list = format_list[i].field_list;
	structs[i].struct_size = struct_size_field_list(structs[i].field_list, (int)sizeof(char*));
	structs[i].opt_info = NULL;
    }
    structs[count].format_name = NULL;
    structs[count].field_list = NULL;
    return EVassoc_filter_action(cm, stone, structs, handler, out_stone, client_data);
}